

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<float> __thiscall Imath_3_2::Quat<float>::inverse(Quat<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  Quat<float> *in_RSI;
  undefined1 auVar5 [16];
  Quat<float> QVar6;
  Quat<float> QVar7;
  
  QVar7.r = operator^(in_RSI,in_RSI);
  uVar1 = (in_RSI->v).y;
  uVar3 = (in_RSI->v).z;
  uVar2 = in_RSI->r;
  auVar5._0_8_ = CONCAT44((in_RSI->v).x,uVar2) ^ 0x8000000000000000;
  auVar5._8_4_ = uVar1 ^ 0x80000000;
  auVar5._12_4_ = uVar3 ^ 0x80000000;
  auVar4._4_4_ = QVar7.r;
  auVar4._0_4_ = QVar7.r;
  auVar4._8_4_ = QVar7.r;
  auVar4._12_4_ = QVar7.r;
  QVar6 = (Quat<float>)divps(auVar5,auVar4);
  *this = QVar6;
  QVar7.v.x = QVar7.r;
  QVar7.v._4_8_ = QVar6._0_8_;
  return QVar7;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Quat<T>
                 Quat<T>::inverse () const IMATH_NOEXCEPT
{
    //
    // 1    Q*
    // - = ----   where Q* is conjugate (operator~)
    // Q   Q* Q   and (Q* Q) == Q ^ Q (4D dot)
    //

    T qdot = *this ^ *this;
    return Quat (r / qdot, -v / qdot);
}